

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O2

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentsOperands
          (LLVMPointerGraphBuilder *this,Function *F,CallInst *CI,uint index)

{
  const_arg_iterator pAVar1;
  const_arg_iterator pAVar2;
  iterator iVar3;
  const_arg_iterator local_38;
  
  pAVar1 = llvm::Function::arg_begin(F);
  pAVar2 = llvm::Function::arg_end(F);
  for (; pAVar1 != pAVar2; pAVar1 = pAVar1 + 0x28) {
    local_38 = pAVar1;
    iVar3 = std::
            _Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(this + 0x188),(key_type *)&local_38);
    if (CI == (CallInst *)0x0) {
      addArgumentOperands(this,F,(PSNode *)
                                 **(undefined8 **)
                                   ((long)iVar3.
                                          super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                                          ._M_cur + 0x10),index);
    }
    else {
      addArgumentOperands(this,CI,(PSNode *)
                                  **(undefined8 **)
                                    ((long)iVar3.
                                           super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                                           ._M_cur + 0x10),index);
    }
    index = index + 1;
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentsOperands(const llvm::Function *F,
                                                   const llvm::CallInst *CI,
                                                   unsigned index) {
    for (auto A = F->arg_begin(), E = F->arg_end(); A != E; ++A, ++index) {
        auto it = nodes_map.find(&*A);
        assert(it != nodes_map.end());
        PSNodesSeq &cur = it->second;

        if (CI) {
            // with func ptr call we know from which
            // call we should take the values
            addArgumentOperands(CI, cur.getSingleNode(), index);
        } else {
            // with regular call just use all calls
            addArgumentOperands(F, cur.getSingleNode(), index);
        }
    }
}